

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::fixConstInit
          (HlslParseContext *this,TSourceLoc *loc,TString *identifier,TType *type,
          TIntermTyped **initializer)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermAggregate *pTVar2;
  char *pcVar3;
  TIntermTyped **initializer_local;
  TType *type_local;
  TString *identifier_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  if ((*initializer == (TIntermTyped *)0x0) &&
     ((iVar1 = (*type->_vptr_TType[10])(),
      ((uint)*(undefined8 *)(CONCAT44(extraout_var,iVar1) + 8) & 0x7f) == 2 ||
      (iVar1 = (*type->_vptr_TType[10])(),
      ((uint)*(undefined8 *)(CONCAT44(extraout_var_00,iVar1) + 8) & 0x7f) == 0x13)))) {
    pTVar2 = TIntermediate::makeAggregate
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,loc);
    *initializer = (TIntermTyped *)pTVar2;
    pcVar3 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       (identifier);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
              (this,loc,"variable with qualifier \'const\' not initialized; zero initializing",
               pcVar3,"");
  }
  return;
}

Assistant:

void HlslParseContext::fixConstInit(const TSourceLoc& loc, const TString& identifier, TType& type,
                                    TIntermTyped*& initializer)
{
    //
    // Make the qualifier make sense, given that there is an initializer.
    //
    if (initializer == nullptr) {
        if (type.getQualifier().storage == EvqConst ||
            type.getQualifier().storage == EvqConstReadOnly) {
            initializer = intermediate.makeAggregate(loc);
            warn(loc, "variable with qualifier 'const' not initialized; zero initializing", identifier.c_str(), "");
        }
    }
}